

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStackSwitch
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,StackSwitch *curr,
          optional<wasm::HeapType> ct)

{
  ulong uVar1;
  bool bVar2;
  HeapType *pHVar3;
  size_t sVar4;
  size_t sVar5;
  Expression **childp;
  Type *pTVar6;
  Type local_68;
  uintptr_t local_60;
  ulong local_58;
  size_t i;
  Signature local_48;
  Type local_38;
  Type params;
  StackSwitch *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  optional<wasm::HeapType> ct_local;
  
  this_local = ct.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType>._M_payload;
  ct_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
       ct.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_engaged;
  bVar2 = std::optional<wasm::HeapType>::has_value((optional<wasm::HeapType> *)&this_local);
  if (!bVar2) {
    params.id = (uintptr_t)wasm::Type::getHeapType(&curr->cont->type);
    std::optional<wasm::HeapType>::operator=
              ((optional<wasm::HeapType> *)&this_local,(HeapType *)&params);
  }
  pHVar3 = std::optional<wasm::HeapType>::operator->((optional<wasm::HeapType> *)&this_local);
  bVar2 = HeapType::isContinuation(pHVar3);
  if (!bVar2) {
    __assert_fail("ct->isContinuation()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                  ,0x48a,
                  "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStackSwitch(StackSwitch *, std::optional<HeapType>) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
                 );
  }
  pHVar3 = std::optional<wasm::HeapType>::operator->((optional<wasm::HeapType> *)&this_local);
  i = (size_t)HeapType::getContinuation(pHVar3);
  local_48 = HeapType::getSignature((HeapType *)&i);
  local_38.id = local_48.params.id;
  sVar4 = wasm::Type::size(&local_38);
  bVar2 = false;
  if (sVar4 != 0) {
    sVar4 = wasm::Type::size(&local_38);
    sVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                      (&(curr->operands).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    bVar2 = sVar4 - 1 == sVar5;
  }
  if (!bVar2) {
    __assert_fail("params.size() >= 1 && ((params.size() - 1) == curr->operands.size())",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                  ,0x48d,
                  "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitStackSwitch(StackSwitch *, std::optional<HeapType>) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
                 );
  }
  local_58 = 0;
  while( true ) {
    uVar1 = local_58;
    sVar4 = wasm::Type::size(&local_38);
    if (sVar4 - 1 <= uVar1) break;
    childp = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                       (&(curr->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                        local_58);
    pTVar6 = wasm::Type::operator[](&local_38,local_58);
    local_60 = pTVar6->id;
    note(this,childp,(Type)local_60);
    local_58 = local_58 + 1;
  }
  pHVar3 = std::optional<wasm::HeapType>::operator*((optional<wasm::HeapType> *)&this_local);
  wasm::Type::Type(&local_68,(HeapType)pHVar3->id,Nullable,Inexact);
  note(this,&curr->cont,local_68);
  return;
}

Assistant:

void visitStackSwitch(StackSwitch* curr,
                        std::optional<HeapType> ct = std::nullopt) {
    if (!ct.has_value()) {
      ct = curr->cont->type.getHeapType();
    }
    assert(ct->isContinuation());
    auto params = ct->getContinuation().type.getSignature().params;
    assert(params.size() >= 1 &&
           ((params.size() - 1) == curr->operands.size()));
    for (size_t i = 0; i < params.size() - 1; ++i) {
      note(&curr->operands[i], params[i]);
    }
    note(&curr->cont, Type(*ct, Nullable));
  }